

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ai_way.cxx
# Opt level: O3

void __thiscall xray_re::way_link_io::operator()(way_link_io *this,way_link *link,xr_writer *w)

{
  undefined8 in_RAX;
  uint16_t local_18;
  undefined1 local_16 [2];
  float local_14;
  
  _local_18 = CONCAT62((int6)((ulong)in_RAX >> 0x10),link->from);
  (*w->_vptr_xr_writer[2])(w,&local_18,2);
  _local_18 = CONCAT22(link->to,local_18);
  (*w->_vptr_xr_writer[2])(w,local_16,2);
  _local_18 = CONCAT44(link->weight,_local_18);
  (*w->_vptr_xr_writer[2])(w,&local_14,4);
  return;
}

Assistant:

void way_link_io::operator()(const way_link& link, xr_writer& w) const
{
	w.w_u16(link.from);
	w.w_u16(link.to);
	w.w_float(link.weight);
}